

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O0

ostream * operator<<(ostream *co,Vertex *v)

{
  int iVar1;
  ostream *this;
  void *this_00;
  Vertex *v_local;
  ostream *co_local;
  
  this = std::operator<<(co,"Vertex ");
  iVar1 = MeshLib::Vertex::id(v);
  this_00 = (void *)std::ostream::operator<<(this,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return co;
}

Assistant:

std::ostream & operator << ( std::ostream & co, const Vertex & v)
{
    co << "Vertex " << v.id() << std::endl;
    return co;
}